

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> * __thiscall
TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::operator=
          (TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this,
          TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *o)

{
  hash_t size;
  
  this->NumUsed = 0;
  M_Free(this->Nodes);
  this->Nodes = (Node *)0x0;
  this->LastFree = (Node *)0x0;
  this->Size = 0;
  this->NumUsed = 0;
  size = CountUsed(o);
  SetNodeVector(this,size);
  CopyNodes(this,o->Nodes,o->Size);
  return this;
}

Assistant:

TMap &operator= (const TMap &o)
	{
		NumUsed = 0;
		ClearNodeVector();
		SetNodeVector(o.CountUsed());
		CopyNodes(o.Nodes, o.Size);
		return *this;
	}